

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  OPJ_UINT32 b;
  OPJ_UINT32 local_24;
  OPJ_UINT32 l_max;
  OPJ_UINT32 l_nb_tiles;
  OPJ_UINT32 l_nb_comp;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  opj_j2k_t *p_j2k_local;
  
  local_24 = 0;
  OVar1 = (p_j2k->m_cp).tw;
  OVar2 = (p_j2k->m_cp).th;
  uVar3 = p_j2k->m_private_image->numcomps;
  for (l_nb_comp = 0; l_nb_comp < OVar1 * OVar2; l_nb_comp = l_nb_comp + 1) {
    for (l_nb_tiles = 0; l_nb_tiles < uVar3; l_nb_tiles = l_nb_tiles + 1) {
      b = opj_j2k_get_SPCod_SPCoc_size(p_j2k,l_nb_comp,l_nb_tiles);
      local_24 = opj_uint_max(local_24,b);
    }
  }
  return local_24 + 6;
}

Assistant:

static OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_tiles;
    OPJ_UINT32 l_max = 0;

    /* preconditions */

    l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th ;
    l_nb_comp = p_j2k->m_private_image->numcomps;

    for (i = 0; i < l_nb_tiles; ++i) {
        for (j = 0; j < l_nb_comp; ++j) {
            l_max = opj_uint_max(l_max, opj_j2k_get_SPCod_SPCoc_size(p_j2k, i, j));
        }
    }

    return 6 + l_max;
}